

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

int32_t ggml_get_i32_1d(ggml_tensor *tensor,int i)

{
  undefined8 uVar1;
  char *pcVar2;
  
  switch(tensor->type) {
  case GGML_TYPE_Q4_0:
    pcVar2 = "false";
    uVar1 = 0xb0a;
    break;
  case GGML_TYPE_Q4_1:
    pcVar2 = "false";
    uVar1 = 0xb0e;
    break;
  case GGML_TYPE_I8:
    if (tensor->nb[0] == 1) {
      return (int)*(char *)((long)tensor->data + (long)i);
    }
    pcVar2 = "tensor->nb[0] == sizeof(int8_t)";
    uVar1 = 0xb12;
    break;
  case GGML_TYPE_I16:
    if (tensor->nb[0] == 2) {
      return (int)*(short *)((long)tensor->data + (long)i * 2);
    }
    pcVar2 = "tensor->nb[0] == sizeof(int16_t)";
    uVar1 = 0xb17;
    break;
  case GGML_TYPE_I32:
    if (tensor->nb[0] == 4) {
      return *(int32_t *)((long)tensor->data + (long)i * 4);
    }
    pcVar2 = "tensor->nb[0] == sizeof(int32_t)";
    uVar1 = 0xb1c;
    break;
  case GGML_TYPE_F16:
    if (tensor->nb[0] == 2) {
      return (int)table_f32_f16[*(ushort *)((long)tensor->data + (long)i * 2)];
    }
    pcVar2 = "tensor->nb[0] == sizeof(ggml_fp16_t)";
    uVar1 = 0xb21;
    break;
  case GGML_TYPE_F32:
    if (tensor->nb[0] == 4) {
      return (int)*(float *)((long)tensor->data + (long)i * 4);
    }
    pcVar2 = "tensor->nb[0] == sizeof(float)";
    uVar1 = 0xb26;
    break;
  case GGML_TYPE_COUNT:
    pcVar2 = "false";
    uVar1 = 0xb2b;
    break;
  default:
    return 0;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",uVar1,
          pcVar2);
  abort();
}

Assistant:

int32_t ggml_get_i32_1d(const struct ggml_tensor * tensor, int i) {
    switch (tensor->type) {
        case GGML_TYPE_Q4_0:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_Q4_1:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_I8:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int8_t));
                return ((int8_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_I16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int16_t));
                return ((int16_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_I32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int32_t));
                return ((int32_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_fp16_t));
                return GGML_FP16_TO_FP32(((ggml_fp16_t *)(tensor->data))[i]);
            } break;
        case GGML_TYPE_F32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(float));
                return ((float *)(tensor->data))[i];
            } break;
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }

    return 0.0f;
}